

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t quicly_send_close_invalid_token
                 (quicly_context_t *ctx,uint32_t protocol_version,ptls_iovec_t dest_cid,
                 ptls_iovec_t src_cid,char *err_desc,void *datagram)

{
  ptls_iovec_t salt_00;
  _func_void_st_quicly_crypto_engine_t_ptr_quicly_conn_t_ptr_ptls_cipher_context_t_ptr_ptls_aead_context_t_ptr_ptls_iovec_t_size_t_size_t_uint64_t_int
  *p_Var1;
  int iVar2;
  st_ptls_salt_t *p;
  uint8_t *puVar3;
  size_t in_RCX;
  uint8_t *puVar4;
  void *in_RDX;
  uint8_t *puVar5;
  uint32_t in_ESI;
  void *in_R8;
  size_t in_R9;
  ptls_iovec_t pVar6;
  undefined1 *in_stack_00000010;
  size_t datagram_len;
  uint8_t *payload_from;
  uint8_t *length_at;
  uint8_t *dst;
  st_ptls_salt_t *salt;
  st_quicly_cipher_context_t egress;
  quicly_context_t *in_stack_ffffffffffffff30;
  char *reason_phrase;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint64_t in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff70 [16];
  st_quicly_cipher_context_t *in_stack_ffffffffffffff80;
  st_quicly_cipher_context_t *in_stack_ffffffffffffff88;
  ptls_cipher_suite_t *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  ptls_aead_context_t *in_stack_ffffffffffffffb8;
  quicly_conn_t *in_stack_ffffffffffffffc0;
  size_t local_8;
  
  iVar2 = in_stack_ffffffffffffff70._12_4_;
  memset(&stack0xffffffffffffffb8,0,0x10);
  p = get_salt(in_ESI);
  if (p == (st_ptls_salt_t *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    get_aes128gcmsha256(in_stack_ffffffffffffff30);
    pVar6 = ptls_iovec_init(p,0x14);
    reason_phrase = (char *)0x0;
    pVar6.len = (size_t)pVar6.base;
    pVar6.base = in_stack_ffffffffffffff98;
    salt_00.len = (size_t)in_stack_ffffffffffffffb8;
    salt_00.base = p->initial;
    iVar2 = setup_initial_encryption
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,pVar6,iVar2,salt_00,in_stack_ffffffffffffffc0);
    if (iVar2 == 0) {
      *in_stack_00000010 = 0xc1;
      puVar3 = quicly_encode32(in_stack_00000010 + 1,in_ESI);
      puVar5 = puVar3 + 1;
      *puVar3 = (uint8_t)in_RCX;
      memcpy(puVar5,in_RDX,in_RCX);
      puVar3 = puVar5 + in_RCX + 1;
      puVar5[in_RCX] = (uint8_t)in_R9;
      memcpy(puVar3,in_R8,in_R9);
      puVar3 = puVar3 + in_R9;
      puVar5 = puVar3 + 1;
      *puVar3 = '\0';
      puVar3[2] = '\0';
      puVar4 = puVar3 + 4;
      puVar3[3] = '\0';
      puVar3 = quicly_encode_close_frame
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          reason_phrase);
      puVar3 = puVar3 + in_stack_ffffffffffffffb8->algo->tag_size;
      if (0x4b0 < (long)puVar3 - (long)in_stack_00000010) {
        __assert_fail("dst - (uint8_t *)datagram <= QUICLY_MIN_CLIENT_INITIAL_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x11a2,
                      "size_t quicly_send_close_invalid_token(quicly_context_t *, uint32_t, ptls_iovec_t, ptls_iovec_t, const char *, void *)"
                     );
      }
      if (0x3f < (long)(puVar3 + (-1 - (long)puVar5))) {
        __assert_fail("dst - length_at - 1 < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x11a3,
                      "size_t quicly_send_close_invalid_token(quicly_context_t *, uint32_t, ptls_iovec_t, ptls_iovec_t, const char *, void *)"
                     );
      }
      *puVar5 = ((char)puVar3 - (char)puVar5) + 0xff;
      p_Var1 = quicly_default_crypto_engine.encrypt_packet;
      local_8 = (long)puVar3 - (long)in_stack_00000010;
      pVar6 = ptls_iovec_init(in_stack_00000010,local_8);
      (*p_Var1)(&quicly_default_crypto_engine,(quicly_conn_t *)0x0,
                (ptls_cipher_context_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,pVar6,0
                ,(long)puVar4 - (long)in_stack_00000010,0,0);
      dispose_cipher((st_quicly_cipher_context_t *)0x13a5bf);
    }
    else {
      local_8 = 0xffffffffffffffff;
    }
  }
  return local_8;
}

Assistant:

size_t quicly_send_close_invalid_token(quicly_context_t *ctx, uint32_t protocol_version, ptls_iovec_t dest_cid,
                                       ptls_iovec_t src_cid, const char *err_desc, void *datagram)
{
    struct st_quicly_cipher_context_t egress = {};
    const struct st_ptls_salt_t *salt;

    /* setup keys */
    if ((salt = get_salt(protocol_version)) == NULL)
        return SIZE_MAX;
    if (setup_initial_encryption(get_aes128gcmsha256(ctx), NULL, &egress, src_cid, 0,
                                 ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL) != 0)
        return SIZE_MAX;

    uint8_t *dst = datagram, *length_at;

    /* build packet */
    PTLS_BUILD_ASSERT(QUICLY_SEND_PN_SIZE == 2);
    *dst++ = QUICLY_PACKET_TYPE_INITIAL | 0x1 /* 2-byte PN */;
    dst = quicly_encode32(dst, protocol_version);
    *dst++ = dest_cid.len;
    memcpy(dst, dest_cid.base, dest_cid.len);
    dst += dest_cid.len;
    *dst++ = src_cid.len;
    memcpy(dst, src_cid.base, src_cid.len);
    dst += src_cid.len;
    *dst++ = 0;        /* token_length = 0 */
    length_at = dst++; /* length_at to be filled in later as 1-byte varint */
    *dst++ = 0;        /* PN = 0 */
    *dst++ = 0;        /* ditto */
    uint8_t *payload_from = dst;
    dst = quicly_encode_close_frame(dst, QUICLY_ERROR_GET_ERROR_CODE(QUICLY_TRANSPORT_ERROR_INVALID_TOKEN),
                                    QUICLY_FRAME_TYPE_PADDING, err_desc);

    /* determine the size of the packet, make adjustments */
    dst += egress.aead->algo->tag_size;
    assert(dst - (uint8_t *)datagram <= QUICLY_MIN_CLIENT_INITIAL_SIZE);
    assert(dst - length_at - 1 < 64);
    *length_at = dst - length_at - 1;
    size_t datagram_len = dst - (uint8_t *)datagram;

    /* encrypt packet */
    quicly_default_crypto_engine.encrypt_packet(&quicly_default_crypto_engine, NULL, egress.header_protection, egress.aead,
                                                ptls_iovec_init(datagram, datagram_len), 0, payload_from - (uint8_t *)datagram, 0,
                                                0);

    dispose_cipher(&egress);
    return datagram_len;
}